

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O2

qsizetype bm_find(QStringView haystack,qsizetype index,QStringView needle,uchar *skiptable,
                 CaseSensitivity cs)

{
  long lVar1;
  bool bVar2;
  char32_t cVar3;
  ulong uVar4;
  char16_t *start;
  char16_t *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  qsizetype qVar9;
  long lVar10;
  char16_t *start_00;
  ulong uVar11;
  char16_t *ch;
  long in_FS_OFFSET;
  QStringView s;
  QStringView local_248;
  char16_t foldBuffer [256];
  
  uVar11 = needle.m_size;
  start = needle.m_data;
  lVar10 = haystack.m_size;
  start_00 = haystack.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar11 == 0) {
    qVar9 = -1;
    if (index <= lVar10) {
      qVar9 = index;
    }
  }
  else if (cs == CaseSensitive) {
    uVar6 = 0;
    if (0 < (long)uVar11) {
      uVar6 = uVar11;
    }
    qVar9 = -1;
    pcVar5 = start_00 + index + (uVar11 - 1);
    while (pcVar5 < start_00 + lVar10) {
      uVar7 = (ulong)skiptable[(byte)*pcVar5];
      if ((ulong)skiptable[(byte)*pcVar5] == 0) {
        lVar8 = 0;
        while( true ) {
          if (-lVar8 == uVar6) {
            qVar9 = ((long)pcVar5 - (long)start_00 >> 1) - (uVar11 - 1);
            goto LAB_0014b727;
          }
          if (pcVar5[lVar8] != start[uVar11 + lVar8 + -1]) break;
          lVar8 = lVar8 + -1;
        }
        uVar7 = lVar8 + uVar11;
        if (skiptable[(byte)pcVar5[lVar8]] != uVar11) {
          uVar7 = 1;
        }
      }
      bVar2 = start_00 + lVar10 + -uVar7 < pcVar5;
      pcVar5 = pcVar5 + uVar7;
      if (bVar2) break;
    }
  }
  else {
    memset(foldBuffer,0xaa,0x200);
    uVar6 = 0x100;
    if ((long)uVar11 < 0x100) {
      uVar6 = uVar11;
    }
    lVar8 = 0;
    uVar7 = 0;
    if (0 < (long)uVar6) {
      uVar7 = uVar6;
    }
    for (; uVar7 * 2 != lVar8; lVar8 = lVar8 + 2) {
      cVar3 = foldCase((char16_t *)(lVar8 + (long)start),start);
      *(short *)((long)foldBuffer + lVar8) = (short)cVar3;
    }
    pcVar5 = start_00 + index + (uVar6 - 1);
    do {
      if (start_00 + lVar10 <= pcVar5) break;
      cVar3 = foldCase(pcVar5,start_00);
      uVar4 = (ulong)skiptable[(uint)(cVar3 & 0xff)];
      if ((ulong)skiptable[(uint)(cVar3 & 0xff)] == 0) {
        ch = pcVar5;
        for (lVar8 = 0; -lVar8 != uVar7; lVar8 = lVar8 + -1) {
          cVar3 = foldCase(ch,start_00);
          if (cVar3 != (uint)(ushort)foldBuffer[uVar6 + lVar8 + -1]) {
            uVar4 = -lVar8;
            goto LAB_0014b6c0;
          }
          ch = ch + -1;
        }
        qVar9 = ((long)pcVar5 - (long)start_00 >> 1) - (uVar6 - 1);
        lVar8 = uVar6 + qVar9;
        if (lVar10 <= (long)(uVar6 + qVar9)) {
          lVar8 = lVar10;
        }
        local_248.m_size = lVar10 - lVar8;
        local_248.m_data = start_00 + lVar8;
        if (((long)uVar11 < 0x101) ||
           (s.m_size = uVar11 - uVar6, s.m_data = start + uVar6,
           bVar2 = QStringView::startsWith(&local_248,s,CaseInsensitive), uVar4 = uVar7,
           lVar8 = -uVar7, bVar2)) goto LAB_0014b727;
LAB_0014b6c0:
        cVar3 = foldCase(pcVar5 + lVar8,start_00);
        uVar4 = uVar6 - uVar4;
        if (skiptable[(uint)(cVar3 & 0xff)] != uVar11) {
          uVar4 = 1;
        }
      }
      bVar2 = pcVar5 <= start_00 + lVar10 + -uVar4;
      pcVar5 = pcVar5 + uVar4;
    } while (bVar2);
    qVar9 = -1;
  }
LAB_0014b727:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return qVar9;
}

Assistant:

static inline qsizetype bm_find(QStringView haystack, qsizetype index, QStringView needle,
                          const uchar *skiptable, Qt::CaseSensitivity cs)
{
    const char16_t *uc = haystack.utf16();
    const qsizetype l = haystack.size();
    const char16_t *puc = needle.utf16();
    const qsizetype pl = needle.size();

    if (pl == 0)
        return index > l ? -1 : index;

    if (cs == Qt::CaseSensitive) {
        const qsizetype pl_minus_one = pl - 1;
        const char16_t *current = uc + index + pl_minus_one;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[*current & 0xff];
            if (!skip) {
                // possible match
                while (skip < pl) {
                    if (*(current - skip) != puc[pl_minus_one-skip])
                        break;
                    ++skip;
                }
                if (skip > pl_minus_one) // we have a match
                    return (current - uc) - pl_minus_one;

                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[*(current - skip) & 0xff] == pl)
                    skip = pl - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    } else {
        char16_t foldBuffer[FoldBufferCapacity];
        const qsizetype foldBufferLength = qMin(FoldBufferCapacity, pl);
        const char16_t *start = puc;
        for (qsizetype i = 0; i < foldBufferLength; ++i)
            foldBuffer[i] = foldCase(&puc[i], start);
        QStringView restNeedle = needle.sliced(foldBufferLength);
        const qsizetype foldBufferEnd = foldBufferLength - 1;
        const char16_t *current = uc + index + foldBufferEnd;
        const char16_t *end = uc + l;

        while (current < end) {
            qsizetype skip = skiptable[foldCase(current, uc) & 0xff];
            if (!skip) {
                // possible match
                while (skip < foldBufferLength) {
                    if (foldCase(current - skip, uc) != foldBuffer[foldBufferEnd - skip])
                        break;
                    ++skip;
                }
                if (skip > foldBufferEnd) { // Matching foldBuffer
                    qsizetype candidatePos = (current - uc) - foldBufferEnd;
                    QStringView restHaystack =
                            haystack.sliced(qMin(haystack.size(), candidatePos + foldBufferLength));
                    if (restNeedle.size() == 0
                        || restHaystack.startsWith(
                                restNeedle, Qt::CaseInsensitive)) // Check the rest of the string
                        return candidatePos;
                }
                // in case we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (skiptable[foldCase(current - skip, uc) & 0xff] == foldBufferLength)
                    skip = foldBufferLength - skip;
                else
                    skip = 1;
            }
            if (current > end - skip)
                break;
            current += skip;
        }
    }
    return -1; // not found
}